

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

exr_result_t
write_tile_chunk(_internal_exr_context *pctxt,int part_index,_internal_exr_part *part,int tilex,
                int tiley,int levelx,int levely,void *packed_data,uint64_t packed_size,
                uint64_t unpacked_size,void *sample_data,uint64_t sample_data_size)

{
  uint64_t *puVar1;
  exr_storage_t eVar2;
  int iVar3;
  exr_result_t eVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  ulong uVar9;
  char *pcVar10;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  int cidx;
  uint64_t local_90;
  void *local_88;
  uint64_t local_80;
  void *local_78;
  uint64_t *ctable;
  int32_t data [6];
  int64_t ddata [3];
  
  if (pctxt->mode == '\x03') {
    eVar2 = part->storage_mode;
    if ((eVar2 & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
      UNRECOVERED_JUMPTABLE_00 = pctxt->standard_error;
      eVar4 = 0x13;
    }
    else {
      if (pctxt->cur_output_part == part_index) {
        if (packed_data == (void *)0x0 || packed_size == 0) {
          UNRECOVERED_JUMPTABLE = pctxt->print_error;
          pcVar10 = "Invalid packed data argument size %lu pointer %p";
          sample_data_size = packed_size;
          sample_data = packed_data;
        }
        else if (packed_size >> 0x1f == 0 || eVar2 == EXR_STORAGE_DEEP_TILED) {
          if ((eVar2 != EXR_STORAGE_DEEP_TILED) ||
             (sample_data != (void *)0x0 && sample_data_size != 0)) {
            local_80 = unpacked_size;
            local_88 = sample_data;
            local_90 = sample_data_size;
            local_78 = packed_data;
            cidx = -1;
            eVar4 = validate_and_compute_tile_chunk_off(pctxt,part,tilex,tiley,levelx,levely,&cidx);
            iVar8 = cidx;
            if (eVar4 == 0) {
              lVar11 = (long)cidx;
              if ((lVar11 < 0) || (part->chunk_count <= cidx)) {
                eVar4 = (*pctxt->print_error)
                                  (pctxt,3,
                                   "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d"
                                   ,(ulong)(uint)tilex,(ulong)(uint)tiley,levelx,(ulong)(uint)levely
                                   ,lVar11,(ulong)(uint)part->chunk_count);
              }
              else {
                if ((part->lineorder != EXR_LINEORDER_RANDOM_Y) &&
                   (pctxt->last_output_chunk != cidx - 1U)) {
                  eVar4 = (*pctxt->print_error)
                                    (pctxt,0x19,
                                     "Chunk index %d is not the next chunk to be written (last %d)",
                                     (ulong)(uint)cidx,(ulong)(uint)pctxt->last_output_chunk,
                                     pctxt->print_error);
                  return eVar4;
                }
                bVar13 = pctxt->is_multipart != '\0';
                if (bVar13) {
                  data[0] = part_index;
                }
                uVar5 = (uint)bVar13;
                uVar9 = (ulong)(uVar5 * 4);
                *(int *)((long)data + uVar9) = tilex;
                *(int *)((long)data + uVar9 + 4) = tiley;
                data[(ulong)uVar5 + 2] = levelx;
                uVar6 = uVar5 + 4;
                uVar12 = (ulong)uVar6;
                *(int *)((long)data + uVar9 + 0xc) = levely;
                if (part->storage_mode != EXR_STORAGE_DEEP_TILED) {
                  uVar6 = uVar5 + 5;
                  data[uVar12] = (int32_t)packed_size;
                }
                eVar4 = alloc_chunk_table(pctxt,part,&ctable);
                if (eVar4 == 0) {
                  puVar1 = &pctxt->output_file_offset;
                  ctable[lVar11] = pctxt->output_file_offset;
                  eVar4 = (*pctxt->do_write)(pctxt,data,(ulong)(uVar6 << 2),puVar1);
                  if ((eVar4 == 0) && (eVar4 = 0, part->storage_mode == EXR_STORAGE_DEEP_TILED)) {
                    ddata[0] = local_90;
                    ddata[1] = packed_size;
                    ddata[2] = local_80;
                    eVar4 = (*pctxt->do_write)(pctxt,ddata,0x18,puVar1);
                    if (eVar4 == 0) {
                      eVar4 = (*pctxt->do_write)(pctxt,local_88,local_90,puVar1);
                    }
                  }
                  if (eVar4 == 0) {
                    eVar4 = (*pctxt->do_write)(pctxt,local_78,packed_size,puVar1);
                  }
                  if (eVar4 == 0) {
                    iVar7 = pctxt->output_chunk_count + 1;
                    pctxt->output_chunk_count = iVar7;
                    iVar3 = part->chunk_count;
                    if (iVar7 == iVar3) {
                      ddata[0] = part->chunk_table_offset;
                      iVar8 = pctxt->cur_output_part + 1;
                      pctxt->cur_output_part = iVar8;
                      if (iVar8 == pctxt->num_parts) {
                        pctxt->mode = '\x04';
                      }
                      pctxt->last_output_chunk = -1;
                      pctxt->output_chunk_count = 0;
                      eVar4 = (*pctxt->do_write)(pctxt,ctable,(long)iVar3 << 3,(uint64_t *)ddata);
                    }
                    else {
                      pctxt->last_output_chunk = iVar8;
                      eVar4 = 0;
                    }
                  }
                }
              }
            }
            return eVar4;
          }
          UNRECOVERED_JUMPTABLE = pctxt->print_error;
          pcVar10 = "Invalid sample count data argument size %lu pointer %p";
        }
        else {
          UNRECOVERED_JUMPTABLE = pctxt->print_error;
          pcVar10 = "Packed data size %lu too large (max %lu)";
          sample_data = (void *)0x7fffffff;
          sample_data_size = packed_size;
        }
        eVar4 = (*UNRECOVERED_JUMPTABLE)
                          (pctxt,3,pcVar10,sample_data_size,sample_data,UNRECOVERED_JUMPTABLE);
        return eVar4;
      }
      UNRECOVERED_JUMPTABLE_00 = pctxt->standard_error;
      eVar4 = 0x18;
    }
  }
  else if (pctxt->mode == '\x01') {
    UNRECOVERED_JUMPTABLE_00 = pctxt->standard_error;
    eVar4 = 9;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = pctxt->standard_error;
    eVar4 = 8;
  }
  eVar4 = (*UNRECOVERED_JUMPTABLE_00)(pctxt,eVar4);
  return eVar4;
}

Assistant:

static exr_result_t
write_tile_chunk (
    struct _internal_exr_context* pctxt,
    int                           part_index,
    struct _internal_exr_part*    part,
    int                           tilex,
    int                           tiley,
    int                           levelx,
    int                           levely,
    const void*                   packed_data,
    uint64_t                      packed_size,
    uint64_t                      unpacked_size,
    const void*                   sample_data,
    uint64_t                      sample_data_size)
{
    exr_result_t rv;
    int32_t      data[6];
    int32_t      psize;
    int          cidx, wrcnt;
    uint64_t*    ctable;

    if (pctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (pctxt->mode == EXR_CONTEXT_WRITE)
            return pctxt->standard_error (pctxt, EXR_ERR_HEADER_NOT_WRITTEN);
        return pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE);
    }

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        return pctxt->standard_error (pctxt, EXR_ERR_TILE_SCAN_MIXEDAPI);
    }

    if (pctxt->cur_output_part != part_index)
        return pctxt->standard_error (pctxt, EXR_ERR_INCORRECT_PART);

    if (!packed_data || packed_size == 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid packed data argument size %" PRIu64 " pointer %p",
            (uint64_t) packed_size,
            packed_data);

    if (part->storage_mode != EXR_STORAGE_DEEP_TILED &&
        packed_size > (uint64_t) INT32_MAX)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Packed data size %" PRIu64 " too large (max %" PRIu64 ")",
            (uint64_t) packed_size,
            (uint64_t) INT32_MAX);
    psize = (int32_t) packed_size;

    if (part->storage_mode == EXR_STORAGE_DEEP_TILED &&
        (!sample_data || sample_data_size == 0))
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid sample count data argument size %" PRIu64 " pointer %p",
            (uint64_t) sample_data_size,
            sample_data);

    cidx = -1;
    rv   = validate_and_compute_tile_chunk_off (
        pctxt, part, tilex, tiley, levelx, levely, &cidx);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (cidx < 0 || cidx >= part->chunk_count)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Chunk index for tile (%d, %d) at level (%d, %d) %d outside chunk count %d",
            tilex,
            tiley,
            levelx,
            levely,
            cidx,
            part->chunk_count);
    }

    if (part->lineorder != EXR_LINEORDER_RANDOM_Y &&
        pctxt->last_output_chunk != (cidx - 1))
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INCORRECT_CHUNK,
            "Chunk index %d is not the next chunk to be written (last %d)",
            cidx,
            pctxt->last_output_chunk);
    }

    wrcnt = 0;
    if (pctxt->is_multipart) { data[wrcnt++] = part_index; }
    data[wrcnt++] = tilex;
    data[wrcnt++] = tiley;
    data[wrcnt++] = levelx;
    data[wrcnt++] = levely;
    if (part->storage_mode != EXR_STORAGE_DEEP_TILED) data[wrcnt++] = psize;

    priv_from_native32 (data, wrcnt);

    rv = alloc_chunk_table (pctxt, part, &ctable);
    if (rv != EXR_ERR_SUCCESS) return rv;

    ctable[cidx] = pctxt->output_file_offset;
    rv           = pctxt->do_write (
        pctxt,
        data,
        (uint64_t) (wrcnt) * sizeof (int32_t),
        &(pctxt->output_file_offset));
    if (rv == EXR_ERR_SUCCESS && part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        int64_t ddata[3];
        ddata[0] = (int64_t) sample_data_size;
        ddata[1] = (int64_t) packed_size;
        ddata[2] = (int64_t) unpacked_size;

        priv_from_native64 (ddata, 3);

        rv = pctxt->do_write (
            pctxt, ddata, 3 * sizeof (uint64_t), &(pctxt->output_file_offset));

        if (rv == EXR_ERR_SUCCESS)
            rv = pctxt->do_write (
                pctxt,
                sample_data,
                sample_data_size,
                &(pctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS)
        rv = pctxt->do_write (
            pctxt, packed_data, packed_size, &(pctxt->output_file_offset));

    if (rv == EXR_ERR_SUCCESS)
    {
        ++(pctxt->output_chunk_count);
        if (pctxt->output_chunk_count == part->chunk_count)
        {
            uint64_t chunkoff = part->chunk_table_offset;

            ++(pctxt->cur_output_part);
            if (pctxt->cur_output_part == pctxt->num_parts)
                pctxt->mode = EXR_CONTEXT_WRITE_FINISHED;
            pctxt->last_output_chunk  = -1;
            pctxt->output_chunk_count = 0;

            priv_from_native64 (ctable, part->chunk_count);
            rv = pctxt->do_write (
                pctxt,
                ctable,
                sizeof (uint64_t) * (uint64_t) (part->chunk_count),
                &chunkoff);
            /* just in case we look at it again? */
            priv_to_native64 (ctable, part->chunk_count);
        }
        else { pctxt->last_output_chunk = cidx; }
    }

    return rv;
}